

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratingInstance.cpp
# Opt level: O2

void __thiscall GeneratingInstance::Build(GeneratingInstance *this,Instance *instance)

{
  pointer pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Task *task;
  pointer pTVar5;
  Tasks *__range1;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Task local_38;
  
  iVar2 = rand();
  iVar8 = iVar2 % 0x61 + 3;
  iVar2 = rand();
  iVar6 = (iVar2 % 0x28 + 10) * iVar8;
  iVar4 = 0;
  iVar2 = 0;
  if (0 < iVar8) {
    iVar2 = iVar8;
  }
  iVar7 = 0;
  for (; iVar4 != iVar2; iVar4 = iVar4 + 1) {
    for (iVar10 = 0; iVar6 - iVar10 != 0 && iVar10 <= iVar6; iVar10 = iVar9 + iVar10) {
      iVar3 = rand();
      iVar9 = iVar3 % 1000 + 3;
      if (iVar6 < iVar3 % 1000 + iVar10 + 3) {
        iVar9 = iVar6 - iVar10;
      }
      local_38.length = iVar9;
      local_38.id = iVar7;
      std::vector<Task,_std::allocator<Task>_>::emplace_back<Task>(&instance->tasks,&local_38);
      iVar7 = iVar7 + 1;
    }
  }
  std::random_shuffle<__gnu_cxx::__normal_iterator<Task*,std::vector<Task,std::allocator<Task>>>>
            ((instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
             super__Vector_impl_data._M_start,
             (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pTVar1 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = 0;
  for (pTVar5 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    pTVar5->id = iVar2;
    iVar2 = iVar2 + 1;
  }
  instance->numProcessors = iVar8;
  return;
}

Assistant:

void GeneratingInstance::Build(Instance& instance){
	int numberOfCores = rand() % 97 + 3;
	int numberOfTaksSoFar = 0;
	int optimalProcessingTime = numberOfCores * (rand() %40 + 10);
	//Randomly generate Instance's optimum

	for(int i = 0; i < numberOfCores; i++){
		//For every core, generate a random number of tasks, which lengths (also random) when added equal optimum
		int coreLengthSoFar = 0;
		while(coreLengthSoFar<optimalProcessingTime){
			int newTaskLength = rand() %1000 + 3;
			if(coreLengthSoFar + newTaskLength > optimalProcessingTime)
			//Check if newTaskLength does not overload core (aka does not increase optimal processing time), if so trim new TaskLength, so it fits
				newTaskLength = optimalProcessingTime - coreLengthSoFar;

			instance.tasks.push_back(Task(newTaskLength, numberOfTaksSoFar));
			numberOfTaksSoFar++;
			coreLengthSoFar += newTaskLength;
		}
	}

	std::random_shuffle(instance.tasks.begin(), instance.tasks.end());
	//reshuffle for even more random result
	
	int i = 0;
	for(auto& task : instance.tasks){
		task.setId(i);
		i++;
	}

	instance.numProcessors = numberOfCores;
}